

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O2

void __thiscall
sptk::KaiserWindow::KaiserWindow(KaiserWindow *this,int window_length,double beta,bool periodic)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  int i;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_00118d00;
  this->window_length_ = window_length;
  this->beta_ = beta;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) || (dVar8 = 0.0, beta < 0.0)) {
    this->is_valid_ = false;
  }
  else {
    this_00 = &this->window_;
    pvVar3 = this_00;
    std::vector<double,_std::allocator<double>_>::resize(this_00,(ulong)(uint)window_length);
    iVar2 = this->window_length_;
    if (iVar2 == 1) {
      *(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else {
      dVar5 = (double)(int)(iVar2 - (this->periodic_ ^ 1)) * 0.5;
      dVar8 = anon_unknown.dwarf_4a98c::I0(this->beta_,(int)pvVar3,dVar8);
      pdVar1 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
        dVar9 = ((double)(int)lVar4 - dVar5) / dVar5;
        dVar7 = this->beta_;
        dVar9 = dVar9 * dVar9;
        dVar6 = 1.0 - dVar9;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar7 = anon_unknown.dwarf_4a98c::I0(dVar7 * dVar6,(int)pvVar3,dVar9);
        pdVar1[lVar4] = dVar7 * (1.0 / dVar8);
        iVar2 = this->window_length_;
      }
    }
  }
  return;
}

Assistant:

KaiserWindow::KaiserWindow(int window_length, double beta, bool periodic)
    : window_length_(window_length),
      beta_(beta),
      periodic_(periodic),
      is_valid_(true) {
  if (window_length_ <= 0 || beta_ < 0.0) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const double a(0.5 * (periodic_ ? window_length_ : window_length_ - 1));
  const double z(1.0 / I0(beta_));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    const double x((i - a) / a);
    window[i] = z * I0(beta_ * std::sqrt(1.0 - x * x));
  }
}